

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall SchnorrPubkey_FromPubkey_Test::TestBody(SchnorrPubkey_FromPubkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_560;
  Message local_558;
  string local_550;
  string local_530;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_6;
  Pubkey pk_aa1;
  AssertHelper local_4c8;
  Message local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__3;
  Message local_4a0;
  string local_498;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_448;
  Message local_440;
  bool local_431;
  undefined1 local_430 [8];
  AssertionResult gtest_ar__2;
  Message local_418;
  string local_410;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_3c0;
  Message local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar__1;
  Message local_398;
  string local_390;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_340;
  Message local_338;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_;
  Message local_310;
  string local_308;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_2;
  SchnorrPubkey spk_b2;
  SchnorrPubkey spk_b1;
  SchnorrPubkey spk_a2;
  SchnorrPubkey spk_a1;
  string local_270 [3];
  bool parity [4];
  string exp_pk_c2p;
  string local_248 [8];
  string exp_pk_c2;
  undefined1 local_220 [8];
  string exp_pk_b;
  undefined1 local_1f8 [8];
  string exp_pk_a;
  string local_1d0;
  undefined1 local_1b0 [8];
  Pubkey pk_b2;
  string local_190;
  undefined1 local_170 [8];
  Pubkey pk_b1;
  string local_150;
  undefined1 local_130 [8];
  Pubkey pk_a2;
  string local_110;
  undefined1 local_f0 [8];
  Pubkey pk_a1;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  Pubkey local_48;
  undefined1 local_30 [8];
  SchnorrPubkey actual_pubkey;
  bool is_parity;
  SchnorrPubkey_FromPubkey_Test *this_local;
  
  actual_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  cfd::core::Privkey::GetPubkey(&local_48,&::sk);
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)local_30,&local_48,
             (bool *)((long)&actual_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::~Pubkey(&local_48);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_88,&::pubkey);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_a8,(SchnorrPubkey *)local_30);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_68,"pubkey.GetHex()","actual_pubkey.GetHex()",&local_88,
             &local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_c8,"pubkey_parity","is_parity",&pubkey_parity,
             (bool *)((long)&actual_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &pk_a1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &pk_a1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &pk_a1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,
             "024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)
             ((long)&pk_a2.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_f0,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk_a2.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_150,
             "034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)
             ((long)&pk_b1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk_b1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_190,
             "02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)
             ((long)&pk_b2.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_170,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk_b2.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d0,
             "03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)(exp_pk_a.field_2._M_local_buf + 0xf));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1b0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)(exp_pk_a.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_1f8,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)(exp_pk_b.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_pk_b.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_220,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)(exp_pk_c2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_pk_c2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_248,"03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124",
             (allocator *)(exp_pk_c2p.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_pk_c2p.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_270,"02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124",
             (allocator *)
             ((long)&spk_a1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&spk_a1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)
             &spk_a2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_f0,
             (bool *)((long)&spk_a1.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)
             &spk_b1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_130,
             (bool *)((long)&spk_a1.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)
             &spk_b2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_170,
             (bool *)((long)&spk_a1.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)&gtest_ar_2.message_,(Pubkey *)local_1b0,
             (bool *)((long)&spk_a1.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_308,
             (SchnorrPubkey *)
             &spk_a2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_2e8,"exp_pk_a","spk_a1.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
             &local_308);
  std::__cxx11::string::~string((string *)&local_308);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_329 = (bool)(~spk_a1.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._3_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_328,&local_329,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_328,(AssertionResult *)"parity[0]",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_390,
             (SchnorrPubkey *)
             &spk_b1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_370,"exp_pk_a","spk_a2.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
             &local_390);
  std::__cxx11::string::~string((string *)&local_390);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3b0,
             (bool *)((long)&spk_a1.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_3b0,(AssertionResult *)"parity[1]",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_410,
             (SchnorrPubkey *)
             &spk_b2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_3f0,"exp_pk_b","spk_b1.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
             &local_410);
  std::__cxx11::string::~string((string *)&local_410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_431 = (bool)(~spk_a1.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._5_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_430,&local_431,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_430,(AssertionResult *)"parity[2]",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_448,&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_498,(SchnorrPubkey *)&gtest_ar_2.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_478,"exp_pk_b","spk_b2.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
             &local_498);
  std::__cxx11::string::~string((string *)&local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4b8,
             (bool *)((long)&spk_a1.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 6),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &pk_aa1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_4b8,
               (AssertionResult *)"parity[3]","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper(&local_4c8);
    std::__cxx11::string::~string
              ((string *)
               &pk_aa1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  cfd::core::SchnorrPubkey::CreatePubkey
            ((Pubkey *)&gtest_ar_6.message_,
             (SchnorrPubkey *)
             &spk_a2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (bool)(spk_a1.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._3_1_ & 1));
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_530,(Pubkey *)local_f0);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_550,(Pubkey *)&gtest_ar_6.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_510,"pk_a1.GetHex()","pk_aa1.GetHex()",&local_530,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_530);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_558);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              (&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=(&local_560,&local_558);
    testing::internal::AssertHelper::~AssertHelper(&local_560);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_ar_6.message_);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&gtest_ar_2.message_);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &spk_b2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &spk_b1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &spk_a2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)local_1f8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_1b0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_170);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_130);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_f0);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_30);
  return;
}

Assistant:

TEST(SchnorrPubkey, FromPubkey) {
  bool is_parity = false;
  auto actual_pubkey = SchnorrPubkey::FromPubkey(sk.GetPubkey(), &is_parity);
  EXPECT_EQ(pubkey.GetHex(), actual_pubkey.GetHex());
  EXPECT_EQ(pubkey_parity, is_parity);

  Pubkey pk_a1("024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_a2("034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_b1("02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  Pubkey pk_b2("03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  std::string exp_pk_a = "4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d";
  std::string exp_pk_b = "dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54";
  std::string exp_pk_c2 = "03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";
  std::string exp_pk_c2p = "02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";

  bool parity[4];
  auto spk_a1 = SchnorrPubkey::FromPubkey(pk_a1, &parity[0]);
  auto spk_a2 = SchnorrPubkey::FromPubkey(pk_a2, &parity[1]);
  auto spk_b1 = SchnorrPubkey::FromPubkey(pk_b1, &parity[2]);
  auto spk_b2 = SchnorrPubkey::FromPubkey(pk_b2, &parity[3]);

  EXPECT_EQ(exp_pk_a, spk_a1.GetHex());
  EXPECT_FALSE(parity[0]);
  EXPECT_EQ(exp_pk_a, spk_a2.GetHex());
  EXPECT_TRUE(parity[1]);
  EXPECT_EQ(exp_pk_b, spk_b1.GetHex());
  EXPECT_FALSE(parity[2]);
  EXPECT_EQ(exp_pk_b, spk_b2.GetHex());
  EXPECT_TRUE(parity[3]);

  Pubkey pk_aa1 = spk_a1.CreatePubkey(parity[0]);
  EXPECT_EQ(pk_a1.GetHex(), pk_aa1.GetHex());

}